

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

void aom_comp_mask_pred_c
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  int iVar4;
  
  if (0 < height) {
    puVar2 = pred;
    iVar1 = width;
    if (invert_mask == 0) {
      puVar2 = ref;
      ref = pred;
      iVar1 = ref_stride;
      ref_stride = width;
    }
    iVar4 = 0;
    do {
      if (0 < width) {
        uVar3 = 0;
        do {
          comp_pred[uVar3] =
               (uint8_t)((uint)puVar2[uVar3] * (uint)mask[uVar3] + 0x20 +
                         (uint)ref[uVar3] * (0x40 - (uint)mask[uVar3]) >> 6);
          uVar3 = uVar3 + 1;
        } while ((uint)width != uVar3);
      }
      comp_pred = comp_pred + width;
      puVar2 = puVar2 + iVar1;
      ref = ref + ref_stride;
      mask = mask + mask_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

void aom_comp_mask_pred_c(uint8_t *comp_pred, const uint8_t *pred, int width,
                          int height, const uint8_t *ref, int ref_stride,
                          const uint8_t *mask, int mask_stride,
                          int invert_mask) {
  int i, j;
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      comp_pred[j] = AOM_BLEND_A64(mask[j], src0[j], src1[j]);
    }
    comp_pred += width;
    src0 += stride0;
    src1 += stride1;
    mask += mask_stride;
  }
}